

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ez-rpc.c++
# Opt level: O0

void __thiscall
capnp::EzRpcClient::Impl::Impl
          (Impl *this,sockaddr *serverAddress,uint addrSize,ReaderOptions readerOpts)

{
  int iVar1;
  EzRpcContext *this_00;
  AsyncIoProvider *pAVar2;
  undefined4 extraout_var;
  Impl *local_88;
  Impl *local_80;
  int local_78;
  Own<kj::NetworkAddress> local_60;
  undefined1 local_50 [16];
  Promise<void> local_40;
  uint local_2c;
  sockaddr *psStack_28;
  uint addrSize_local;
  sockaddr *serverAddress_local;
  Impl *this_local;
  ReaderOptions readerOpts_local;
  
  this_local = (Impl *)readerOpts.traversalLimitInWords;
  readerOpts_local.traversalLimitInWords._0_4_ = readerOpts.nestingLimit;
  local_2c = addrSize;
  psStack_28 = serverAddress;
  serverAddress_local = (sockaddr *)this;
  EzRpcContext::getThreadLocal();
  this_00 = kj::Own<capnp::EzRpcContext>::operator->(&this->context);
  pAVar2 = EzRpcContext::getIoProvider(this_00);
  iVar1 = (*pAVar2->_vptr_AsyncIoProvider[3])();
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 8))
            (&local_60,(long *)CONCAT44(extraout_var,iVar1),psStack_28,local_2c);
  connectAttach((capnp *)local_50,&local_60);
  local_78 = (int)readerOpts_local.traversalLimitInWords;
  local_80 = this_local;
  local_88 = this;
  kj::Promise<kj::Own<kj::AsyncIoStream>>::
  then<capnp::EzRpcClient::Impl::Impl(sockaddr_const*,unsigned_int,capnp::ReaderOptions)::_lambda(kj::Own<kj::AsyncIoStream>&&)_1_,kj::_::PropagateException>
            ((Promise<kj::Own<kj::AsyncIoStream>> *)&local_40,(Type *)local_50,
             (PropagateException *)&local_88);
  kj::Promise<void>::fork((Promise<void> *)&this->setupPromise);
  kj::Promise<void>::~Promise(&local_40);
  kj::Promise<kj::Own<kj::AsyncIoStream>_>::~Promise
            ((Promise<kj::Own<kj::AsyncIoStream>_> *)local_50);
  kj::Own<kj::NetworkAddress>::~Own(&local_60);
  kj::Maybe<kj::Own<capnp::EzRpcClient::Impl::ClientContext>_>::Maybe(&this->clientContext);
  return;
}

Assistant:

Impl(const struct sockaddr* serverAddress, uint addrSize,
       ReaderOptions readerOpts)
      : context(EzRpcContext::getThreadLocal()),
        setupPromise(
            connectAttach(context->getIoProvider().getNetwork()
                .getSockaddr(serverAddress, addrSize))
            .then([this, readerOpts](kj::Own<kj::AsyncIoStream>&& stream) {
              clientContext = kj::heap<ClientContext>(kj::mv(stream),
                                                      readerOpts);
            }).fork()) {}